

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O1

void do_resets(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  RESET_DATA **ppRVar2;
  int iVar3;
  ROOM_INDEX_DATA *pRVar4;
  AREA_DATA_conflict *pAVar5;
  RESET_DATA *pRVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  MOB_INDEX_DATA *pMVar11;
  RESET_DATA *pRVar12;
  OBJ_INDEX_DATA *pOVar13;
  short sVar14;
  RESET_DATA *pRVar15;
  short sVar16;
  char arg3 [4608];
  char arg4 [4608];
  char arg2 [4608];
  char arg5 [4608];
  char arg1 [4608];
  char arg7 [4608];
  char arg6 [4608];
  char acStack_7e38 [4608];
  char local_6c38 [4608];
  char local_5a38 [4608];
  char local_4838 [4608];
  char local_3638 [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  bVar7 = check_security(ch);
  if (!bVar7) {
    return;
  }
  pcVar9 = one_argument(argument,local_3638);
  pcVar9 = one_argument(pcVar9,local_5a38);
  pcVar9 = one_argument(pcVar9,acStack_7e38);
  pcVar9 = one_argument(pcVar9,local_6c38);
  pcVar9 = one_argument(pcVar9,local_4838);
  pcVar9 = one_argument(pcVar9,local_1238);
  one_argument(pcVar9,local_2438);
  bVar7 = is_switched(ch);
  pcVar9 = "Resets: Invalid security for editing this area.\n\r";
  if (bVar7) goto LAB_0035c040;
  pRVar4 = ch->in_room;
  iVar8 = ch->pcdata->security;
  pAVar5 = pRVar4->area;
  iVar3 = pAVar5->security;
  if ((((iVar8 <= iVar3) && (pcVar10 = strstr(pAVar5->builders,ch->name), iVar8 <= iVar3)) &&
      (pcVar10 == (char *)0x0)) &&
     (pcVar10 = strstr(pAVar5->builders,"All"), pcVar10 == (char *)0x0)) goto LAB_0035c040;
  if (local_3638[0] == '\0') {
    if (pRVar4->reset_first == (RESET_DATA *)0x0) {
      send_to_char("No resets in this room.\n\r",ch);
    }
    else {
      send_to_char("Resets: M = mobile, R = room, O = object, P = pet, S = shopkeeper\n\r",ch);
      display_resets(ch);
    }
  }
  bVar7 = is_number(local_3638);
  if (!bVar7) {
    return;
  }
  pRVar4 = ch->in_room;
  bVar7 = str_cmp(local_5a38,"delete");
  if (!bVar7) {
    iVar8 = atoi(local_3638);
    if (ch->in_room->reset_first == (RESET_DATA *)0x0) {
      pcVar9 = "No resets in this area.\n\r";
    }
    else {
      ppRVar2 = &pRVar4->reset_first;
      if (iVar8 < 2) {
        pRVar12 = *ppRVar2;
        pRVar6 = pRVar12->next;
        *ppRVar2 = pRVar6;
        if (pRVar6 == (RESET_DATA *)0x0) {
          pRVar4->reset_last = (RESET_DATA *)0x0;
        }
      }
      else {
        pRVar6 = (RESET_DATA *)0x0;
        pRVar12 = (RESET_DATA *)ppRVar2;
        do {
          pRVar15 = pRVar6;
          pRVar12 = pRVar12->next;
          if (pRVar12 == (RESET_DATA *)0x0) {
            send_to_char("Reset not found.\n\r",ch);
            goto LAB_0035c3dc;
          }
          iVar8 = iVar8 + -1;
          pRVar6 = pRVar12;
        } while (iVar8 != 0);
        if (pRVar15 == (RESET_DATA *)0x0) {
          pRVar15 = (RESET_DATA *)ppRVar2;
        }
        pRVar15->next = pRVar15->next->next;
        pRVar6 = *ppRVar2;
        do {
          pRVar15 = pRVar6;
          pRVar6 = pRVar15->next;
        } while (pRVar6 != (RESET_DATA *)0x0);
        pRVar4->reset_last = pRVar15;
LAB_0035c3dc:
        if (pRVar12 == (RESET_DATA *)0x0) {
          return;
        }
      }
      free_reset_data(pRVar12);
      pcVar9 = "Reset deleted.\n\r";
    }
    goto LAB_0035c040;
  }
  bVar7 = str_cmp(local_5a38,"door");
  if (bVar7) {
    bVar7 = str_cmp(local_5a38,"follow");
    if (bVar7) {
      bVar7 = str_cmp(local_5a38,"mob");
      if (((bVar7) || (bVar7 = is_number(acStack_7e38), !bVar7)) &&
         ((bVar7 = str_cmp(local_5a38,"obj"), bVar7 || (bVar7 = is_number(acStack_7e38), !bVar7))))
      {
        send_to_char("Syntax: RESET <number> OBJ <vnum> <wear_loc>\n\r",ch);
        send_to_char("        RESET <number> OBJ <vnum> inside <vnum> [limit] [count]\n\r",ch);
        send_to_char("        RESET <number> OBJ <vnum> room\n\r",ch);
        send_to_char("        RESET <number> MOB <vnum> [max # area] [max # room]\n\r",ch);
        send_to_char("        RESET <number> DELETE\n\r",ch);
        send_to_char("        RESET <number> DOOR <direction> <closed/locked>\n\r",ch);
        pcVar9 = "        RESET <number> FOLLOW <follower vnum> <leader vnum>\n\r";
        goto LAB_0035c040;
      }
      bVar7 = str_cmp(local_5a38,"mob");
      if (bVar7) {
        bVar7 = str_cmp(local_5a38,"obj");
        if (bVar7) {
          pRVar12 = (RESET_DATA *)0x0;
        }
        else {
          pRVar12 = new_reset_data();
          atoi(acStack_7e38);
          pOVar13 = get_obj_index(0);
          if (pOVar13 == (OBJ_INDEX_DATA *)0x0) {
            pcVar9 = "That object does not exist.\n\r";
            goto LAB_0035c040;
          }
          iVar8 = atoi(acStack_7e38);
          pRVar12->arg1 = (short)iVar8;
          bVar7 = str_prefix(local_6c38,"inside");
          if (bVar7) {
            bVar7 = str_cmp(local_6c38,"room");
            if (bVar7) {
              iVar8 = flag_value(wear_loc_flags,local_6c38);
              if (iVar8 == -99) {
                pcVar9 = "Resets: \'? wear-loc\'\n\r";
                goto LAB_0035c040;
              }
              pRVar12 = new_reset_data();
              atoi(acStack_7e38);
              pOVar13 = get_obj_index(0);
              if (pOVar13 != (OBJ_INDEX_DATA *)0x0) {
                iVar8 = atoi(acStack_7e38);
                pRVar12->arg1 = (short)iVar8;
                iVar8 = flag_value(wear_loc_flags,local_6c38);
                pRVar12->arg3 = (short)iVar8;
                if ((short)iVar8 == -1) {
                  pRVar12->command = 'G';
                }
                else {
                  pRVar12->command = 'E';
                }
                goto LAB_0035c390;
              }
            }
            else {
              pRVar12 = new_reset_data();
              pRVar12->command = 'O';
              atoi(acStack_7e38);
              pOVar13 = get_obj_index(0);
              if (pOVar13 != (OBJ_INDEX_DATA *)0x0) {
                iVar8 = atoi(acStack_7e38);
                pRVar12->arg1 = (short)iVar8;
                sVar14 = 0;
                pRVar12->arg2 = 0;
                pRVar12->arg3 = ch->in_room->vnum;
                goto LAB_0035c6d3;
              }
            }
            pcVar9 = "Vnum does not exist.\n\r";
            goto LAB_0035c040;
          }
          pRVar12->command = 'P';
          pRVar12->arg2 = 0;
          bVar7 = is_number(local_4838);
          if (bVar7) {
            atoi(local_4838);
          }
          pOVar13 = get_obj_index(0);
          if (pOVar13->item_type != 0xf) {
            pcVar9 = "Object2 is not a container\n\r";
            goto LAB_0035c040;
          }
          bVar7 = is_number(local_1238);
          sVar16 = 1;
          sVar14 = 1;
          if (bVar7) {
            iVar8 = atoi(local_1238);
            sVar14 = (short)iVar8;
          }
          pRVar12->arg2 = sVar14;
          bVar7 = is_number(local_4838);
          if (bVar7) {
            iVar8 = atoi(local_4838);
            sVar16 = (short)iVar8;
          }
          pRVar12->arg3 = sVar16;
          bVar7 = is_number(local_2438);
          sVar14 = 1;
          if (bVar7) {
            iVar8 = atoi(local_2438);
            sVar14 = (short)iVar8;
          }
LAB_0035c6d3:
          pRVar12->arg4 = sVar14;
        }
      }
      else {
        pRVar12 = new_reset_data();
        pRVar12->command = 'M';
        bVar7 = is_number(acStack_7e38);
        if (bVar7) {
          atoi(acStack_7e38);
        }
        pMVar11 = get_mob_index(0);
        if (pMVar11 == (MOB_INDEX_DATA *)0x0) {
          pcVar9 = "Mob does not exist.\n\r";
          goto LAB_0035c040;
        }
        iVar8 = atoi(acStack_7e38);
        pRVar12->arg1 = (short)iVar8;
        bVar7 = is_number(local_6c38);
        sVar16 = 1;
        sVar14 = 1;
        if (bVar7) {
          iVar8 = atoi(local_6c38);
          sVar14 = (short)iVar8;
        }
        pRVar12->arg2 = sVar14;
        pRVar12->arg3 = ch->in_room->vnum;
        bVar7 = is_number(local_4838);
        if (bVar7) {
          iVar8 = atoi(local_4838);
          sVar16 = (short)iVar8;
        }
        pRVar12->arg4 = sVar16;
      }
    }
    else {
      pRVar12 = new_reset_data();
      pRVar12->command = 'F';
      atoi(acStack_7e38);
      pMVar11 = get_mob_index(0);
      if (pMVar11 == (MOB_INDEX_DATA *)0x0) {
        pcVar9 = "That is not a valid follower vnum.\n\r";
        goto LAB_0035c040;
      }
      atoi(local_6c38);
      pMVar11 = get_mob_index(0);
      if (pMVar11 == (MOB_INDEX_DATA *)0x0) {
        pcVar9 = "That is not a valid leader vnum.\n\r";
        goto LAB_0035c040;
      }
      iVar8 = atoi(acStack_7e38);
      pRVar12->arg1 = (short)iVar8;
      iVar8 = atoi(local_6c38);
      pRVar12->arg2 = (short)iVar8;
      pRVar12->arg3 = 0;
      pRVar12->arg4 = 0;
    }
  }
  else {
    pRVar12 = new_reset_data();
    pRVar12->command = 'D';
    iVar8 = flag_lookup(acStack_7e38,direction_table);
    if (iVar8 == -99) {
      pcVar9 = "No exit that direction.\n\r";
      goto LAB_0035c040;
    }
    pRVar12->arg1 = pRVar4->vnum;
    iVar8 = flag_lookup(acStack_7e38,direction_table);
    pRVar12->arg2 = (short)iVar8;
    bVar7 = str_cmp(local_6c38,"closed");
    sVar14 = 1;
    if (bVar7) {
      bVar7 = str_cmp(local_6c38,"locked");
      sVar14 = 2;
      if (bVar7) {
        pcVar9 = "Not a possible state.\n\r";
        goto LAB_0035c040;
      }
    }
    pRVar12->arg3 = sVar14;
    pRVar12->arg4 = 0;
  }
LAB_0035c390:
  pRVar4 = ch->in_room;
  iVar8 = atoi(local_3638);
  add_reset(pRVar4,pRVar12,iVar8);
  plVar1 = ch->in_room->area->area_flags;
  *plVar1 = *plVar1 | 8;
  pcVar9 = "Reset added.\n\r";
LAB_0035c040:
  send_to_char(pcVar9,ch);
  return;
}

Assistant:

void do_resets(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	char arg4[MAX_INPUT_LENGTH];
	char arg5[MAX_INPUT_LENGTH];
	char arg6[MAX_INPUT_LENGTH];
	char arg7[MAX_INPUT_LENGTH];
	RESET_DATA *pReset = nullptr;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);
	argument = one_argument(argument, arg4);
	argument = one_argument(argument, arg5);
	argument = one_argument(argument, arg6);
	argument = one_argument(argument, arg7);

	if (!IS_BUILDER(ch, ch->in_room->area))
	{
		send_to_char("Resets: Invalid security for editing this area.\n\r", ch);
		return;
	}

	/*
	 * Display resets in current room.
	 * -------------------------------
	 */
	if (arg1[0] == '\0')
	{
		if (ch->in_room->reset_first)
		{
			send_to_char("Resets: M = mobile, R = room, O = object, "\
						 "P = pet, S = shopkeeper\n\r", ch);
			display_resets(ch);
		}
		else
		{
			send_to_char("No resets in this room.\n\r", ch);
		}
	}

	/*
	 * Take index number and search for commands.
	 * ------------------------------------------
	 */
	if (is_number(arg1))
	{
		ROOM_INDEX_DATA *pRoom = ch->in_room;

		/*
		 * Delete a reset.
		 * ---------------
		 */
		if (!str_cmp(arg2, "delete"))
		{
			int insert_loc = atoi(arg1);

			if (!ch->in_room->reset_first)
			{
				send_to_char("No resets in this area.\n\r", ch);
				return;
			}

			if (insert_loc - 1 <= 0)
			{
				pReset = pRoom->reset_first;
				pRoom->reset_first = pRoom->reset_first->next;

				if (!pRoom->reset_first)
					pRoom->reset_last = nullptr;
			}
			else
			{
				int iReset = 0;
				RESET_DATA *prev = nullptr;

				for (pReset = pRoom->reset_first; pReset; pReset = pReset->next)
				{
					if (++iReset == insert_loc)
						break;
					prev = pReset;
				}

				if (!pReset)
				{
					send_to_char("Reset not found.\n\r", ch);
					return;
				}

				if (prev)
					prev->next = prev->next->next;
				else
					pRoom->reset_first = pRoom->reset_first->next;

				for (pRoom->reset_last = pRoom->reset_first;
					pRoom->reset_last->next;
					pRoom->reset_last = pRoom->reset_last->next);
			}

			free_reset_data(pReset);
			send_to_char("Reset deleted.\n\r", ch);
		}
		else if ((!str_cmp(arg2, "door"))) /* Door reset. */
		{
			pReset = new_reset_data();
			pReset->command = 'D';

			if (flag_lookup(arg3, direction_table) == NO_FLAG)
			{
				send_to_char("No exit that direction.\n\r", ch);
				return;
			}

			pReset->arg1 = pRoom->vnum;
			pReset->arg2 = flag_lookup(arg3, direction_table);

			if (!str_cmp(arg4, "closed"))
			{
				pReset->arg3 = 1;
			}
			else if (!str_cmp(arg4, "locked"))
			{
				pReset->arg3 = 2;
			}
			else
			{
				send_to_char("Not a possible state.\n\r", ch);
				return;
			}

			pReset->arg4 = 0;

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else if (!str_cmp(arg2, "follow")) /* Follow resets */
		{
			pReset = new_reset_data();
			pReset->command = 'F';

			if (get_mob_index(atoi(arg3)) == nullptr)
			{
				send_to_char("That is not a valid follower vnum.\n\r", ch);
				return;
			}

			if (get_mob_index(atoi(arg4)) == nullptr)
			{
				send_to_char("That is not a valid leader vnum.\n\r", ch);
				return;
			}

			pReset->arg1 = atoi(arg3);
			pReset->arg2 = atoi(arg4);
			pReset->arg3 = 0;
			pReset->arg4 = 0;

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else if ((!str_cmp(arg2, "mob") && is_number(arg3)) || (!str_cmp(arg2, "obj") && is_number(arg3))) /* Add a reset. */
		{
			if (!str_cmp(arg2, "mob")) /* Check for Mobile reset. */
			{
				pReset = new_reset_data();
				pReset->command = 'M';

				if (get_mob_index(is_number(arg3) ? atoi(arg3) : 1) == nullptr)
				{
					send_to_char("Mob does not exist.\n\r", ch);
					return;
				}

				pReset->arg1 = atoi(arg3);
				pReset->arg2 = is_number(arg4) ? atoi(arg4) : 1; /* Max # */
				pReset->arg3 = ch->in_room->vnum;
				pReset->arg4 = is_number(arg5) ? atoi(arg5) : 1; /* Min # */
			}
			else if (!str_cmp(arg2, "obj")) /* Check for Object reset. */
			{
				pReset = new_reset_data();
				if (get_obj_index(atoi(arg3)) == nullptr)
					return send_to_char("That object does not exist.\n\r", ch);
				pReset->arg1 = atoi(arg3);

				if (!str_prefix(arg4, "inside")) /* Inside another object. */
				{
					pReset->command = 'P';
					pReset->arg2 = 0;
					if ((get_obj_index(is_number(arg5) ? atoi(arg5) : 1))->item_type != ITEM_CONTAINER)
					{
						send_to_char("Object2 is not a container\n\r", ch);
						return;
					}
					pReset->arg2 = is_number(arg6) ? atoi(arg6) : 1;
					pReset->arg3 = is_number(arg5) ? atoi(arg5) : 1;
					pReset->arg4 = is_number(arg7) ? atoi(arg7) : 1;
				}
				else if (!str_cmp(arg4, "room")) /* Inside the room. */
				{
					pReset = new_reset_data();
					pReset->command = 'O';

					if (get_obj_index(atoi(arg3)) == nullptr)
					{
						send_to_char("Vnum does not exist.\n\r", ch);
						return;
					}

					pReset->arg1 = atoi(arg3);
					pReset->arg2 = 0;
					pReset->arg3 = ch->in_room->vnum;
					pReset->arg4 = 0;
				}
				else /* Into a Mobile's inventory. */
				{
					if (flag_value(wear_loc_flags, arg4) == NO_FLAG)
					{
						send_to_char("Resets: '? wear-loc'\n\r", ch);
						return;
					}

					pReset = new_reset_data();

					if (get_obj_index(atoi(arg3)) == nullptr)
					{
						send_to_char("Vnum does not exist.\n\r", ch);
						return;
					}

					pReset->arg1 = atoi(arg3);
					pReset->arg3 = flag_value(wear_loc_flags, arg4);

					if (pReset->arg3 == WEAR_NONE)
						pReset->command = 'G';
					else
						pReset->command = 'E';
				}
			}

			add_reset(ch->in_room, pReset, atoi(arg1));
			SET_BIT(ch->in_room->area->area_flags, AREA_CHANGED);
			send_to_char("Reset added.\n\r", ch);
		}
		else
		{
			send_to_char("Syntax: RESET <number> OBJ <vnum> <wear_loc>\n\r", ch);
			send_to_char("        RESET <number> OBJ <vnum> inside <vnum> [limit] [count]\n\r", ch);
			send_to_char("        RESET <number> OBJ <vnum> room\n\r", ch);
			send_to_char("        RESET <number> MOB <vnum> [max # area] [max # room]\n\r", ch);
			send_to_char("        RESET <number> DELETE\n\r", ch);
			send_to_char("        RESET <number> DOOR <direction> <closed/locked>\n\r", ch);
			send_to_char("        RESET <number> FOLLOW <follower vnum> <leader vnum>\n\r", ch);
		}
	}
}